

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_pdu.h
# Opt level: O1

int assembler::diffWithWrap<16384u>(uint a,uint b)

{
  int iVar1;
  runtime_error *prVar2;
  int *in_R9;
  char local_3c [4];
  string local_38;
  
  if (0x3fff < a) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_3c[0] = '\x18';
    local_3c[1] = '\0';
    local_3c[2] = '\0';
    local_3c[3] = '\0';
    util::str<char[29],char[101],char[2],int>
              (&local_38,(util *)"Assertion `a < N` failed at ",
               (char (*) [29])
               "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/src/assembler/session_pdu.h"
               ,(char (*) [101])0x143222,(char (*) [2])local_3c,in_R9);
    std::runtime_error::runtime_error(prVar2,(string *)&local_38);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (b < 0x4000) {
    iVar1 = (b - a) + 0x4000;
    if (a <= b) {
      iVar1 = b - a;
    }
    return iVar1;
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_3c[0] = '\x19';
  local_3c[1] = '\0';
  local_3c[2] = '\0';
  local_3c[3] = '\0';
  util::str<char[29],char[101],char[2],int>
            (&local_38,(util *)"Assertion `b < N` failed at ",
             (char (*) [29])
             "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/src/assembler/session_pdu.h"
             ,(char (*) [101])0x143222,(char (*) [2])local_3c,in_R9);
  std::runtime_error::runtime_error(prVar2,(string *)&local_38);
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int diffWithWrap(unsigned int a, unsigned int b) {
  int skip;

  ASSERT(a < N);
  ASSERT(b < N);

  if (a <= b) {
    skip = b - a;
  } else {
    skip = N - a + b;
  }

  return skip;
}